

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::ShaderSource::exec(ShaderSource *this,Thread *t)

{
  undefined1 *puVar1;
  char *pcVar2;
  deUint32 err;
  Thread *pTVar3;
  MessageBuilder *this_00;
  char *shaderSource;
  undefined1 local_1c0 [400];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    pcVar2 = (this->m_source)._M_dataplus._M_p;
    shaderSource = pcVar2;
    local_1c0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glShaderSource(");
    this_00 = tcu::ThreadUtil::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1c0,&((this->m_shader).m_ptr)->shader);
    puVar1 = &this_00->field_0x18;
    std::operator<<((ostream *)puVar1,", 1, \"");
    std::operator<<((ostream *)puVar1,pcVar2);
    std::operator<<((ostream *)puVar1,"\", DE_NULL)");
    tcu::ThreadUtil::MessageBuilder::operator<<(this_00,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x12b8))
              (((this->m_shader).m_ptr)->shader,1,&shaderSource,0);
    err = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"shaderSource(m_shader->shader, 1, &shaderSource, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x58f);
    local_1c0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"End -- glShaderSource()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void ShaderSource::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	const char* shaderSource = m_source.c_str();

	thread.newMessage() << "Begin -- glShaderSource(" << m_shader->shader << ", 1, \"" << shaderSource << "\", DE_NULL)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, shaderSource(m_shader->shader, 1, &shaderSource, DE_NULL));
	thread.newMessage() << "End -- glShaderSource()" << tcu::ThreadUtil::Message::End;
}